

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O2

void google::RawLog__(LogSeverity severity,char *file,int line,char *format,...)

{
  char *pcVar1;
  char cVar2;
  long *plVar3;
  size_t sVar4;
  char in_AL;
  bool bVar5;
  uint uVar6;
  int iVar7;
  id __id;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 *in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t size;
  char *buf;
  int local_19fc;
  char *local_19f8;
  char **local_19f0;
  va_list ap;
  char *local_19c8;
  int local_19c0;
  char *local_19b8;
  size_t local_19b0;
  undefined1 local_19a8 [32];
  undefined8 local_1988;
  undefined8 local_1980;
  undefined8 local_1978;
  undefined8 local_1968;
  undefined8 local_1958;
  undefined8 local_1948;
  undefined8 local_1938;
  undefined8 local_1928;
  undefined8 local_1918;
  undefined8 local_1908;
  ostream oss;
  StaticStringBuf<3000UL> sbuf;
  char buffer [3000];
  
  if (in_AL != '\0') {
    local_1978 = in_XMM0_Qa;
    local_1968 = in_XMM1_Qa;
    local_1958 = in_XMM2_Qa;
    local_1948 = in_XMM3_Qa;
    local_1938 = in_XMM4_Qa;
    local_1928 = in_XMM5_Qa;
    local_1918 = in_XMM6_Qa;
    local_1908 = in_XMM7_Qa;
  }
  local_1988 = in_R8;
  local_1980 = in_R9;
  if ((((fLB::FLAGS_logtostdout != '\0') || (fLB::FLAGS_logtostderr != '\0')) ||
      (fLI::FLAGS_stderrthreshold <= (int)severity)) ||
     ((fLB::FLAGS_alsologtostderr != '\0' || (bVar5 = IsGoogleLoggingInitialized(), !bVar5)))) {
    std::streambuf::streambuf(&sbuf);
    sbuf._0_8_ = &PTR__streambuf_0012dc18;
    pcVar1 = sbuf.data_;
    sbuf._24_8_ = buffer;
    sbuf._8_8_ = pcVar1;
    sbuf._16_8_ = pcVar1;
    sbuf._32_8_ = pcVar1;
    sbuf._40_8_ = pcVar1;
    sbuf._48_8_ = sbuf._24_8_;
    std::ostream::ostream(&oss,&sbuf.super_streambuf);
    *(undefined8 *)(&oss.field_0x10 + (long)oss._vptr_basic_ostream[-3]) = 5;
    __id._M_thread = pthread_self();
    std::operator<<(&oss,__id);
    buf = buffer;
    size = 3000;
    cVar2 = **(char **)(LogSeverityNames + (ulong)severity * 8);
    if ((sbuf._40_8_ != sbuf._32_8_) &&
       ((sbuf._40_8_ != sbuf._48_8_ && (*(char *)(sbuf._40_8_ + -1) != '\0')))) {
      std::streambuf::sputc((char)&sbuf);
    }
    local_19f8 = file;
    pcVar8 = glog_internal_namespace_::const_basename(file);
    local_19fc = line;
    DoRawLog(&buf,&size,"%c00000000 00:00:00.000000 %s %s:%d] RAW: ",(ulong)(uint)(int)cVar2,pcVar1,
             pcVar8,line);
    pcVar1 = buf;
    sVar4 = size;
    ap[0].reg_save_area = local_19a8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x20;
    ap[0].fp_offset = 0x30;
    uVar6 = vsnprintf(buf,size,format,ap);
    pcVar8 = "RAW_LOG ERROR: The Message was too long!\n";
    if (-1 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
      if (uVar9 <= sVar4) {
        buf = pcVar1 + uVar9;
        pcVar8 = "\n";
        size = sVar4 - uVar9;
      }
    }
    DoRawLog(&buf,&size,pcVar8);
    sVar10 = strlen(buffer);
    syscall(1,2,buffer,sVar10);
    if (severity == FATAL) {
      local_19f0 = &local_19c8;
      local_19c8 = local_19f8;
      local_19c0 = local_19fc;
      local_19b8 = pcVar1;
      local_19b0 = sVar4;
      plVar3 = (long *)*in_FS_OFFSET;
      *plVar3 = (long)&local_19f0;
      in_FS_OFFSET = (undefined8 *)*in_FS_OFFSET;
      *in_FS_OFFSET =
           std::once_flag::_Prepare_execution::
           _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
           ::anon_class_1_0_00000001::__invoke;
      iVar7 = pthread_once(&crashed,__once_proxy);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      *plVar3 = 0;
      *in_FS_OFFSET = 0;
      LogMessage::Fail();
    }
    std::ios_base::~ios_base((ios_base *)&oss.field_0x8);
    std::streambuf::~streambuf(&sbuf);
  }
  return;
}

Assistant:

void RawLog__(LogSeverity severity, const char* file, int line,
              const char* format, ...) {
  if (!(FLAGS_logtostdout || FLAGS_logtostderr ||
        severity >= FLAGS_stderrthreshold || FLAGS_alsologtostderr ||
        !IsGoogleLoggingInitialized())) {
    return;  // this stderr log message is suppressed
  }

  // We do not have any any option other that string streams to obtain the
  // thread identifier as the corresponding value is not convertible to an
  // integer. Use a statically allocated buffer to avoid dynamic memory
  // allocations.
  StaticStringBuf<kLogBufSize> sbuf;
  std::ostream oss(&sbuf);

  oss << std::setw(5) << std::this_thread::get_id();

  // can't call localtime_r here: it can allocate
  char buffer[kLogBufSize];
  char* buf = buffer;
  size_t size = sizeof(buffer);

  // NOTE: this format should match the specification in base/logging.h
  DoRawLog(&buf, &size, "%c00000000 00:00:00.000000 %s %s:%d] RAW: ",
           LogSeverityNames[severity][0], sbuf.data(),
           const_basename(const_cast<char*>(file)), line);

  // Record the position and size of the buffer after the prefix
  const char* msg_start = buf;
  const size_t msg_size = size;

  va_list ap;
  va_start(ap, format);
  bool no_chop = VADoRawLog(&buf, &size, format, ap);
  va_end(ap);
  if (no_chop) {
    DoRawLog(&buf, &size, "\n");
  } else {
    DoRawLog(&buf, &size, "RAW_LOG ERROR: The Message was too long!\n");
  }
  // We make a raw syscall to write directly to the stderr file descriptor,
  // avoiding FILE buffering (to avoid invoking malloc()), and bypassing
  // libc (to side-step any libc interception).
  // We write just once to avoid races with other invocations of RawLog__.
  safe_write(STDERR_FILENO, buffer, strlen(buffer));
  if (severity == GLOG_FATAL) {
    std::call_once(crashed, [file, line, msg_start, msg_size] {
      crash_reason.filename = file;
      crash_reason.line_number = line;
      memcpy(crash_buf, msg_start, msg_size);  // Don't include prefix
      crash_reason.message = crash_buf;
#ifdef HAVE_STACKTRACE
      crash_reason.depth =
          GetStackTrace(crash_reason.stack, ARRAYSIZE(crash_reason.stack), 1);
#else
      crash_reason.depth = 0;
#endif
      SetCrashReason(&crash_reason);
    });
    LogMessage::Fail();  // abort()
  }
}